

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

size_t WriteDataToDisk(FILE *file,char *buf,size_t len)

{
  ostream *poVar1;
  size_t in_RDX;
  void *in_RSI;
  FILE *in_RDI;
  size_t write_len;
  Logger *in_stack_fffffffffffffd70;
  allocator *paVar2;
  string *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int line;
  allocator *paVar3;
  string *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  LogSeverity severity;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [36];
  Logger local_12c;
  size_t local_128;
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  Logger local_d0;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [32];
  Logger local_80;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  Logger local_1c;
  size_t local_18;
  
  severity = (LogSeverity)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  if (in_RDI == (FILE *)0x0) {
    Logger::Logger(&local_1c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"WriteDataToDisk",&local_79);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffde8,line,in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc2);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"file");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  if (in_RSI == (void *)0x0) {
    Logger::Logger(&local_80,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"WriteDataToDisk",&local_c9);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffde8,line,in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(poVar1,"CHECK failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc3);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"buf");
    std::operator<<(poVar1," == NULL \n");
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  local_18 = in_RDX;
  if (in_RDX == 0) {
    Logger::Logger(&local_d0,ERR);
    paVar2 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,paVar2);
    paVar3 = &local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"WriteDataToDisk",paVar3);
    poVar1 = Logger::Start(severity,(string *)paVar2,(int)((ulong)paVar3 >> 0x20),
                           in_stack_fffffffffffffdd8);
    poVar1 = std::operator<<(poVar1,"CHECK_GT failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xc4);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"len");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"0");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    Logger::~Logger(in_stack_fffffffffffffd70);
    abort();
  }
  local_128 = fwrite(in_RSI,1,in_RDX,in_RDI);
  if (local_128 != local_18) {
    Logger::Logger(&local_12c,FATAL);
    paVar2 = &local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_150,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,paVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"WriteDataToDisk",&local_179);
    poVar1 = Logger::Start(severity,in_stack_fffffffffffffde8,line,in_stack_fffffffffffffdd8);
    std::operator<<(poVar1,"Error: invoke fwrite().");
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    Logger::~Logger((Logger *)paVar2);
  }
  return local_128;
}

Assistant:

inline size_t WriteDataToDisk(FILE *file, const char *buf, size_t len) {
  CHECK_NOTNULL(file);
  CHECK_NOTNULL(buf);
  CHECK_GT(len, 0);
  size_t write_len = fwrite(buf, 1, len, file);
  if (write_len != len) {
    LOG(FATAL) << "Error: invoke fwrite().";
  }
  return write_len;
}